

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

vm_prop_id_t __thiscall CTPNConst::gen_code_propid(CTPNConst *this,int check_only,int is_expr)

{
  vm_prop_id_t vVar1;
  
  if ((this->super_CTPNConstBase).val_.typ_ == TC_CVT_PROP) {
    vVar1 = *(vm_prop_id_t *)&(this->super_CTPNConstBase).val_.val_;
  }
  else {
    vVar1 = 0;
    if (check_only == 0) {
      CTcTokenizer::log_error(0x2cfd);
    }
  }
  return vVar1;
}

Assistant:

vm_prop_id_t CTPNConst::gen_code_propid(int check_only, int is_expr)
{
    /* check the type */
    switch(val_.get_type())
    {
    case TC_CVT_PROP:
        /* return the constant property ID */
        return (vm_prop_id_t)val_.get_val_prop();

    default:
        /* other values cannot be used as properties */
        if (!check_only)
            G_tok->log_error(TCERR_INVAL_PROP_EXPR);
        return VM_INVALID_PROP;
    }
}